

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.h
# Opt level: O0

void __thiscall LinearScan::LinearScan(LinearScan *this,Func *func)

{
  Func *func_local;
  LinearScan *this_local;
  
  this->func = func;
  this->currentBlockNumber = 0;
  BVUnitT<unsigned_long>::BVUnitT(&this->activeRegs,0);
  BVUnitT<unsigned_long>::BVUnitT(&this->int32Regs,0);
  this->numInt32Regs = 0;
  BVUnitT<unsigned_long>::BVUnitT(&this->floatRegs,0);
  this->numFloatRegs = 0;
  BVUnitT<unsigned_long>::BVUnitT(&this->callerSavedRegs,0);
  BVUnitT<unsigned_long>::BVUnitT(&this->calleeSavedRegs,0);
  BVUnitT<unsigned_long>::BVUnitT(&this->tempRegs,0);
  BVUnitT<unsigned_long>::BVUnitT(&this->instrUseRegs,0);
  BVUnitT<unsigned_long>::BVUnitT(&this->secondChanceRegs,0);
  BVUnitT<unsigned_long>::BVUnitT(&this->callSetupRegs,0);
  this->activeLiveranges = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->intRegUsedCount = 0;
  this->floatRegUsedCount = 0;
  this->loopNest = 0;
  this->m_bailOutRecordCount = 0;
  this->curLoop = (Loop *)0x0;
  this->currentRegion = (Region *)0x0;
  this->globalBailOutRecordTables = (GlobalBailOutRecordDataTable **)0x0;
  this->lastUpdatedRowIndices = (uint **)0x0;
  LinearScanMD::LinearScanMD(&this->linearScanMD,func);
  SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
            (&this->opHelperBlockIter);
  this->currentOpHelperBlock = (OpHelperBlock *)0x0;
  this->totalOpHelperFullVisitedLength = 0;
  BVUnitT<unsigned_long>::BVUnitT(&this->opHelperSpilledRegs,0);
  this->opHelperSpilledLiveranges = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->lastLabel = (LabelInstr *)0x0;
  this->stackPackInUseLiveRanges = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->stackSlotsFreeList = (SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->currentBlock = (LoweredBasicBlock *)0x0;
  BVUnitT<unsigned_long>::BVUnitT(&this->nonAllocatableRegs,0);
  GeneratorBailIn::GeneratorBailIn(&this->bailIn,func,this);
  return;
}

Assistant:

LinearScan(Func *func) : func(func), currentBlockNumber(0), loopNest(0), intRegUsedCount(0), floatRegUsedCount(0), activeLiveranges(NULL),
        linearScanMD(func), opHelperSpilledLiveranges(NULL), currentOpHelperBlock(NULL),
        lastLabel(NULL), numInt32Regs(0), numFloatRegs(0), stackPackInUseLiveRanges(NULL), stackSlotsFreeList(NULL),
        totalOpHelperFullVisitedLength(0), curLoop(NULL), currentBlock(nullptr), currentRegion(nullptr), m_bailOutRecordCount(0),
        globalBailOutRecordTables(nullptr), lastUpdatedRowIndices(nullptr), bailIn(GeneratorBailIn(func, this))
    {
    }